

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O3

bool __thiscall FParseContext::FindSym(FParseContext *this,char *sym,FParseSymbol **val)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  FParseSymbol *pFVar4;
  bool bVar5;
  
  uVar2 = (ulong)(this->symbols).Count;
  if (uVar2 == 0) {
LAB_00588d31:
    bVar5 = false;
  }
  else {
    pFVar4 = (this->symbols).Array;
    iVar1 = strcmp(pFVar4->Sym,sym);
    if (iVar1 == 0) {
      bVar5 = true;
    }
    else {
      uVar3 = 0;
      do {
        if (uVar2 - 1 == uVar3) goto LAB_00588d31;
        iVar1 = strcmp(pFVar4[1].Sym,sym);
        pFVar4 = pFVar4 + 1;
        uVar3 = uVar3 + 1;
      } while (iVar1 != 0);
      bVar5 = uVar3 < uVar2;
    }
    *val = pFVar4;
  }
  return bVar5;
}

Assistant:

bool FParseContext::FindSym (char *sym, FParseSymbol **val)
{
	for(unsigned i=0;i<symbols.Size(); i++)
	{
		if (strcmp (symbols[i].Sym, sym) == 0)
		{
			*val = &symbols[i];
			return true;
		}
	}
	return false;
}